

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O0

size_t iDynTree::countUnknowns(Traversal *traversal,LinkUnknownWrenchContacts *unknownWrenches)

{
  size_t sVar1;
  UnknownWrenchContact *pUVar2;
  long in_RDI;
  UnknownWrenchContact *unknownWrench;
  size_t contact;
  LinkIndex visitedLinkIndex;
  LinkConstPtr visitedLink;
  int traversalEl;
  size_t unknowns;
  LinkIndex in_stack_ffffffffffffffa8;
  LinkUnknownWrenchContacts *in_stack_ffffffffffffffb0;
  ulong local_38;
  int local_1c;
  size_t local_18;
  
  local_18 = 0;
  local_1c = iDynTree::Traversal::getNrOfVisitedLinks();
  while (local_1c = local_1c + -1, -1 < local_1c) {
    iDynTree::Traversal::getLink(in_RDI);
    iDynTree::Link::getIndex();
    for (local_38 = 0;
        sVar1 = LinkUnknownWrenchContacts::getNrOfContactsForLink
                          (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), local_38 < sVar1;
        local_38 = local_38 + 1) {
      pUVar2 = LinkUnknownWrenchContacts::contactWrench
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x545fad);
      in_stack_ffffffffffffffb0 = (LinkUnknownWrenchContacts *)(ulong)pUVar2->unknownType;
      switch(in_stack_ffffffffffffffb0) {
      case (LinkUnknownWrenchContacts *)0x0:
        local_18 = local_18 + 6;
        break;
      case (LinkUnknownWrenchContacts *)0x1:
        local_18 = local_18 + 3;
        break;
      case (LinkUnknownWrenchContacts *)0x2:
        local_18 = local_18 + 1;
        break;
      case (LinkUnknownWrenchContacts *)0x3:
      }
    }
  }
  return local_18;
}

Assistant:

size_t countUnknowns(const Traversal& traversal, const LinkUnknownWrenchContacts& unknownWrenches)
{
    size_t unknowns = 0;

    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();

        // While we are in this loop, we also keep track of the number of unknowns
        for(size_t contact = 0;
            contact < unknownWrenches.getNrOfContactsForLink(visitedLinkIndex);
            contact++ )
        {
            const UnknownWrenchContact & unknownWrench = unknownWrenches.contactWrench(visitedLinkIndex,contact);

            switch( unknownWrench.unknownType )
            {
                case FULL_WRENCH:
                    unknowns += 6;
                    break;
                case PURE_FORCE:
                    unknowns += 3;
                    break;
                case PURE_FORCE_WITH_KNOWN_DIRECTION:
                    unknowns += 1;
                    break;
                case NO_UNKNOWNS:
                    //unknowns += 0;
                    break;
                default:
                    assert(false);
                    break;
            }
        }
    }

    return unknowns;
}